

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall libserver::server::_write_to_socket(server *this,string *_send_message)

{
  bool bVar1;
  size_t size;
  transfer_exactly_t completion_condition;
  ostream *this_00;
  basic_ostream<char,_std::char_traits<char>_> *this_01;
  error_category *peVar2;
  error_code ec_00;
  const_buffer local_38;
  basic_ostream<char,_std::char_traits<char>_> *local_28;
  error_code ec;
  string *_send_message_local;
  server *this_local;
  
  ec.cat_ = (error_category *)_send_message;
  boost::system::error_code::error_code((error_code *)&local_28);
  local_38 = (const_buffer)
             boost::asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ec.cat_
                       );
  size = std::__cxx11::string::length();
  completion_condition = boost::asio::transfer_exactly(size);
  peVar2 = (error_category *)&local_28;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::detail::transfer_exactly_t>
            (&this->socket,(const_buffers_1 *)&local_38,completion_condition,peVar2);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&local_28);
  if (bVar1) {
    this_00 = std::operator<<((ostream *)&std::cout,"Error while writing ");
    ec_00.cat_ = peVar2;
    ec_00.val_ = ec.val_;
    ec_00.failed_ = ec.failed_;
    ec_00._5_3_ = ec._5_3_;
    this_01 = boost::system::operator<<((system *)this_00,local_28,ec_00);
    std::ostream::operator<<((ostream *)this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void libserver::server::_write_to_socket(const std::string& _send_message)
{   
    boost::system::error_code ec;
    boost::asio::write(socket,boost::asio::buffer(_send_message),boost::asio::transfer_exactly(_send_message.length()),&ec);

    if(ec)
    {
        std::cout<<"Error while writing "<<ec<<std::endl;
    }

}